

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  int iVar1;
  ImVec2 *pIVar2;
  int iVar3;
  int iVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if (radius <= 0.0) {
    iVar3 = (this->_Path).Size;
    iVar4 = (this->_Path).Capacity;
    if (iVar3 == iVar4) {
      iVar3 = iVar3 + 1;
      if (iVar4 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar4 / 2 + iVar4;
      }
      if (iVar3 < iVar6) {
        iVar3 = iVar6;
      }
      if (iVar4 < iVar3) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar3 << 3);
        pIVar2 = (this->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar2,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar3;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    goto LAB_0021af00;
  }
  if (0 < num_segments) {
LAB_0021ae8c:
    _PathArcToN(this,center,radius,a_min,a_max,num_segments);
    return;
  }
  if (this->_Data->ArcFastRadiusCutoff < radius) {
    iVar3 = _CalcCircleAutoSegmentCount(this,radius);
    fVar10 = ceilf(((float)iVar3 * ABS(a_max - a_min)) / 6.2831855);
    num_segments = (int)(6.2831855 / ABS(a_max - a_min));
    if (num_segments < (int)fVar10) {
      num_segments = (int)fVar10;
    }
    goto LAB_0021ae8c;
  }
  fVar10 = (a_min * 48.0) / 6.2831855;
  if (a_min <= a_max) {
    fVar10 = ceilf(fVar10);
  }
  else {
    if (0.0 <= fVar10) {
LAB_0021af57:
      iVar3 = (int)fVar10;
    }
    else {
      if ((fVar10 == (float)(int)fVar10) && (!NAN(fVar10) && !NAN((float)(int)fVar10)))
      goto LAB_0021af57;
      iVar3 = (int)fVar10 + -1;
    }
    fVar10 = (float)iVar3;
  }
  fVar14 = (a_max * 48.0) / 6.2831855;
  iVar3 = (int)fVar10;
  if (a_min <= a_max) {
    if (0.0 <= fVar14) {
LAB_0021afc6:
      iVar4 = (int)fVar14;
    }
    else {
      if ((fVar14 == (float)(int)fVar14) && (!NAN(fVar14) && !NAN((float)(int)fVar14)))
      goto LAB_0021afc6;
      iVar4 = (int)fVar14 + -1;
    }
    fVar10 = (float)iVar4;
  }
  else {
    fVar10 = ceilf(fVar14);
  }
  iVar6 = (int)fVar10;
  iVar4 = iVar3 - iVar6;
  if (a_min <= a_max) {
    iVar4 = iVar6 - iVar3;
  }
  iVar8 = 0;
  if (0 < iVar4) {
    iVar8 = iVar4;
  }
  fVar14 = ((float)iVar3 * 3.1415927 + (float)iVar3 * 3.1415927) / 48.0 - a_min;
  fVar10 = a_max - ((float)(int)fVar10 * 3.1415927 + (float)(int)fVar10 * 3.1415927) / 48.0;
  lVar9 = (long)(int)(iVar8 + (-(uint)(fVar14 != 0.0) & 1) + (uint)(fVar10 != 0.0) + 1) +
          (long)(this->_Path).Size;
  iVar8 = (int)lVar9;
  if ((this->_Path).Capacity < iVar8) {
    pIVar5 = (ImVec2 *)ImGui::MemAlloc(lVar9 * 8);
    pIVar2 = (this->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar5,pIVar2,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar5;
    (this->_Path).Capacity = iVar8;
  }
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    fVar14 = center->x;
    fVar11 = cosf(a_min);
    fVar13 = center->y;
    fVar12 = sinf(a_min);
    iVar8 = (this->_Path).Size;
    iVar1 = (this->_Path).Capacity;
    if (iVar8 == iVar1) {
      iVar8 = iVar8 + 1;
      if (iVar1 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar1 / 2 + iVar1;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar1 < iVar8) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar2 = (this->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar2,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    pIVar2 = (this->_Path).Data;
    iVar8 = (this->_Path).Size;
    pIVar2[iVar8].x = fVar11 * radius + fVar14;
    pIVar2[iVar8].y = fVar12 * radius + fVar13;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  if (0 < iVar4) {
    _PathArcToFastEx(this,center,radius,iVar3,iVar6,0);
  }
  if ((fVar10 == 0.0) && (!NAN(fVar10))) {
    return;
  }
  fVar10 = center->x;
  fVar13 = cosf(a_max);
  fVar14 = center->y;
  fVar11 = sinf(a_max);
  iVar3 = (this->_Path).Size;
  iVar4 = (this->_Path).Capacity;
  if (iVar3 == iVar4) {
    iVar3 = iVar3 + 1;
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar4 / 2 + iVar4;
    }
    if (iVar3 < iVar6) {
      iVar3 = iVar6;
    }
    if (iVar4 < iVar3) {
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar3 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar2,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar3;
    }
  }
  pIVar2 = (this->_Path).Data;
  iVar3 = (this->_Path).Size;
  pIVar2[iVar3].x = fVar13 * radius + fVar10;
  pIVar2[iVar3].y = fVar11 * radius + fVar14;
LAB_0021af00:
  (this->_Path).Size = (this->_Path).Size + 1;
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius <= 0.0f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloorSigned(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloorSigned(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = (a_min_segment_angle - a_min) != 0.0f;
        const bool a_emit_end = (a_max - a_max_segment_angle) != 0.0f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}